

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

bool __thiscall
glslang::HlslParseContext::constructorError
          (HlslParseContext *this,TSourceLoc *loc,TIntermNode *node,TFunction *function,TOperator op
          ,TType *type)

{
  TVector<glslang::TArraySize> *pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar12;
  undefined4 extraout_var_05;
  TArraySizes *pTVar13;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TTypeList *pTVar14;
  byte bVar15;
  char *pcVar16;
  int d;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  HlslParseContext *this_01;
  int local_68;
  undefined4 extraout_var_06;
  
  iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  TType::shallowCopy(type,(TType *)CONCAT44(extraout_var,iVar10));
  if ((op - EOpConstructDMat2x2 < 0x24) || (op - EOpConstructMat2x2 < 9)) {
    bVar8 = true;
  }
  else {
    if (op == EOpConstructTextureSampler) {
      pcVar16 = "unhandled texture constructor";
      goto LAB_0038d388;
    }
    bVar8 = false;
  }
  iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (iVar10 < 1) {
    bVar9 = false;
    bVar15 = 0;
    bVar19 = false;
    local_68 = 0;
LAB_0038cf81:
    iVar10 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_05,iVar10) + 8) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar10) + 8) & 0xffffffffffffff80 | 2;
  }
  else {
    bVar4 = true;
    uVar18 = 0;
    bVar9 = false;
    bVar15 = 0;
    bVar19 = false;
    local_68 = 0;
    bVar5 = 0;
    do {
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar18);
      cVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar10) + 8) + 0xe8))();
      if (cVar6 != '\0') {
        iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar18);
        cVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar10) + 8) + 0xf8))();
        bVar9 = true;
        if (cVar6 != '\0') {
          pcVar16 = "array argument must be sized";
          goto LAB_0038d388;
        }
      }
      if (bVar8) {
        iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar18);
        bVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar10) + 8) + 0xe0))();
        bVar15 = bVar15 | bVar7;
      }
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar18);
      iVar10 = TType::computeNumComponents(*(TType **)(CONCAT44(extraout_var_03,iVar10) + 8));
      local_68 = local_68 + iVar10;
      bVar7 = bVar5;
      if ((op != EOpConstructStruct) &&
         (iVar10 = (*type->_vptr_TType[0x1d])(), (char)iVar10 == '\0')) {
        iVar10 = TType::computeNumComponents(type);
        bVar7 = iVar10 <= local_68 | bVar5;
      }
      bVar19 = (bool)(bVar19 | bVar5);
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar18);
      lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar10) + 8) + 0x50))();
      bVar4 = (bool)(bVar4 & (*(uint *)(lVar12 + 8) & 0x7f) == 2);
      uVar17 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar17;
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      bVar5 = bVar7;
    } while ((int)uVar17 < iVar10);
    if (bVar4) goto LAB_0038cf81;
  }
  iVar10 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar10 != '\0') {
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (iVar10 == 0) {
      pcVar16 = "array constructor must have at least one argument";
      goto LAB_0038d388;
    }
    iVar10 = (*type->_vptr_TType[0x1f])(type);
    if ((char)iVar10 == '\0') {
      iVar10 = (*type->_vptr_TType[0xf])(type);
      iVar11 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if ((iVar10 != iVar11) && (iVar10 = TType::computeNumComponents(type), local_68 < iVar10)) {
        pcVar16 = "array constructor needs one argument per array element";
        goto LAB_0038d388;
      }
    }
    else {
      uVar17 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      pTVar13 = type->arraySizes;
      TSmallArrayVector::changeFront(&pTVar13->sizes,uVar17);
      pTVar13->implicitlySized = false;
    }
    if (((type->arraySizes != (TArraySizes *)0x0) &&
        (pTVar1 = (type->arraySizes->sizes).sizes, pTVar1 != (TVector<glslang::TArraySize> *)0x0))
       && (1 < (int)((ulong)((long)(pTVar1->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      iVar10 = (*type->_vptr_TType[0x14])(type);
      pTVar13 = (TArraySizes *)CONCAT44(extraout_var_06,iVar10);
      iVar11 = 0;
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
      cVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_07,iVar10) + 8) + 0xe8))();
      pcVar16 = "array constructor argument not correct type to construct array element";
      if (cVar6 == '\0') goto LAB_0038d388;
      pTVar1 = (pTVar13->sizes).sizes;
      if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
        iVar11 = (int)((ulong)((long)(pTVar1->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])
                         (function,0,
                          "array constructor argument not correct type to construct array element");
      lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar10) + 8) + 0xa0))();
      lVar12 = *(long *)(lVar12 + 8);
      if (lVar12 == 0) {
        iVar10 = 1;
      }
      else {
        iVar10 = (int)((ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8)) >> 4) + 1;
      }
      pcVar16 = "array constructor argument not correct type to construct array element";
      if (iVar11 != iVar10) goto LAB_0038d388;
      bVar8 = TArraySizes::isInnerUnsized(pTVar13);
      if (bVar8) {
        iVar10 = 1;
        while( true ) {
          pTVar1 = (pTVar13->sizes).sizes;
          iVar11 = 0;
          if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
            iVar11 = (int)((ulong)((long)(pTVar1->
                                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ).
                                         super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar1->
                                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ).
                                        super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4);
          }
          if (iVar11 <= iVar10) break;
          uVar17 = TSmallArrayVector::getDimSize((TSmallArrayVector *)pTVar13,iVar10);
          if (uVar17 == 0) {
            iVar11 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
            this_00 = (TSmallArrayVector *)
                      (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar11) + 8) + 0xa0))();
            uVar17 = TSmallArrayVector::getDimSize(this_00,iVar10 + -1);
            TSmallArrayVector::setDimSize((TSmallArrayVector *)pTVar13,iVar10,uVar17);
          }
          iVar10 = iVar10 + 1;
        }
      }
    }
  }
  if (bVar9) {
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if ((op == EOpConstructStruct) || (iVar10 != 1)) {
      if (op == EOpConstructStruct) {
        bVar8 = false;
        goto LAB_0038d2ae;
      }
    }
    else {
      iVar10 = (*type->_vptr_TType[0x1d])(type);
      if (((char)iVar10 != '\0') &&
         (((type->arraySizes == (TArraySizes *)0x0 ||
           (pTVar1 = (type->arraySizes->sizes).sizes, pTVar1 == (TVector<glslang::TArraySize> *)0x0)
           ) || ((int)((ulong)((long)(pTVar1->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2)))) {
        iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
        lVar12 = *(long *)(*(long *)(CONCAT44(extraout_var_10,iVar10) + 8) + 0x60);
        if ((((lVar12 == 0) || (lVar12 = *(long *)(lVar12 + 8), lVar12 == 0)) ||
            ((int)((ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8)) >> 4) < 2)) &&
           (iVar10 = (*type->_vptr_TType[0xc])(), 0 < iVar10)) {
          iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
          iVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar10) + 8) + 0x60))();
          if (0 < iVar10) {
            return false;
          }
        }
      }
    }
    pcVar16 = "constructing non-array constituent from array argument";
    if (((type->arraySizes == (TArraySizes *)0x0) ||
        (pTVar1 = (type->arraySizes->sizes).sizes, pTVar1 == (TVector<glslang::TArraySize> *)0x0))
       || (bVar8 = true,
          (int)((ulong)((long)(pTVar1->
                              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ).
                              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar1->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2))
    goto LAB_0038d388;
  }
  else {
    bVar8 = op != EOpConstructStruct;
  }
LAB_0038d2ae:
  if (((bVar15 & 1) != 0) && (iVar10 = (*type->_vptr_TType[0x1d])(), (char)iVar10 == '\0')) {
    return false;
  }
  if (bVar19) {
    pcVar16 = "too many arguments";
  }
  else {
    if ((op == EOpConstructStruct) &&
       (this_01 = (HlslParseContext *)type, iVar10 = (*type->_vptr_TType[0x1d])(),
       (char)iVar10 == '\0')) {
      bVar9 = isScalarConstructor(this_01,node);
      if (bVar9) {
        return false;
      }
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (iVar10 == 1) {
        iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
        bVar9 = TType::operator==(type,*(TType **)(CONCAT44(extraout_var_12,iVar10) + 8));
        if (bVar9) {
          return false;
        }
      }
      pTVar14 = TType::getStruct(type);
      pTVar2 = (pTVar14->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pTVar3 = (pTVar14->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (iVar10 != (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 5)) {
        pcVar16 = "Number of constructor parameters does not match the number of structure fields";
        goto LAB_0038d388;
      }
    }
    if ((!(bool)(bVar8 & local_68 != 1)) ||
       (iVar10 = TType::computeNumComponents(type), iVar10 <= local_68)) {
      if (op != EOpConstructStruct) {
        return false;
      }
      iVar10 = TType::computeNumComponents(type);
      if (iVar10 <= local_68) {
        return false;
      }
    }
    pcVar16 = "not enough data provided for construction";
  }
LAB_0038d388:
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,pcVar16,"constructor","");
  return true;
}

Assistant:

bool HlslParseContext::constructorError(const TSourceLoc& loc, TIntermNode* node, TFunction& function,
                                        TOperator op, TType& type)
{
    type.shallowCopy(function.getType());

    bool constructingMatrix = false;
    switch (op) {
    case EOpConstructTextureSampler:
        error(loc, "unhandled texture constructor", "constructor", "");
        return true;
    case EOpConstructMat2x2:
    case EOpConstructMat2x3:
    case EOpConstructMat2x4:
    case EOpConstructMat3x2:
    case EOpConstructMat3x3:
    case EOpConstructMat3x4:
    case EOpConstructMat4x2:
    case EOpConstructMat4x3:
    case EOpConstructMat4x4:
    case EOpConstructDMat2x2:
    case EOpConstructDMat2x3:
    case EOpConstructDMat2x4:
    case EOpConstructDMat3x2:
    case EOpConstructDMat3x3:
    case EOpConstructDMat3x4:
    case EOpConstructDMat4x2:
    case EOpConstructDMat4x3:
    case EOpConstructDMat4x4:
    case EOpConstructIMat2x2:
    case EOpConstructIMat2x3:
    case EOpConstructIMat2x4:
    case EOpConstructIMat3x2:
    case EOpConstructIMat3x3:
    case EOpConstructIMat3x4:
    case EOpConstructIMat4x2:
    case EOpConstructIMat4x3:
    case EOpConstructIMat4x4:
    case EOpConstructUMat2x2:
    case EOpConstructUMat2x3:
    case EOpConstructUMat2x4:
    case EOpConstructUMat3x2:
    case EOpConstructUMat3x3:
    case EOpConstructUMat3x4:
    case EOpConstructUMat4x2:
    case EOpConstructUMat4x3:
    case EOpConstructUMat4x4:
    case EOpConstructBMat2x2:
    case EOpConstructBMat2x3:
    case EOpConstructBMat2x4:
    case EOpConstructBMat3x2:
    case EOpConstructBMat3x3:
    case EOpConstructBMat3x4:
    case EOpConstructBMat4x2:
    case EOpConstructBMat4x3:
    case EOpConstructBMat4x4:
        constructingMatrix = true;
        break;
    default:
        break;
    }

    //
    // Walk the arguments for first-pass checks and collection of information.
    //

    int size = 0;
    bool constType = true;
    bool full = false;
    bool overFull = false;
    bool matrixInMatrix = false;
    bool arrayArg = false;
    for (int arg = 0; arg < function.getParamCount(); ++arg) {
        if (function[arg].type->isArray()) {
            if (function[arg].type->isUnsizedArray()) {
                // Can't construct from an unsized array.
                error(loc, "array argument must be sized", "constructor", "");
                return true;
            }
            arrayArg = true;
        }
        if (constructingMatrix && function[arg].type->isMatrix())
            matrixInMatrix = true;

        // 'full' will go to true when enough args have been seen.  If we loop
        // again, there is an extra argument.
        if (full) {
            // For vectors and matrices, it's okay to have too many components
            // available, but not okay to have unused arguments.
            overFull = true;
        }

        size += function[arg].type->computeNumComponents();
        if (op != EOpConstructStruct && ! type.isArray() && size >= type.computeNumComponents())
            full = true;

        if (function[arg].type->getQualifier().storage != EvqConst)
            constType = false;
    }

    if (constType)
        type.getQualifier().storage = EvqConst;

    if (type.isArray()) {
        if (function.getParamCount() == 0) {
            error(loc, "array constructor must have at least one argument", "constructor", "");
            return true;
        }

        if (type.isUnsizedArray()) {
            // auto adapt the constructor type to the number of arguments
            type.changeOuterArraySize(function.getParamCount());
        } else if (type.getOuterArraySize() != function.getParamCount() && type.computeNumComponents() > size) {
            error(loc, "array constructor needs one argument per array element", "constructor", "");
            return true;
        }

        if (type.isArrayOfArrays()) {
            // Types have to match, but we're still making the type.
            // Finish making the type, and the comparison is done later
            // when checking for conversion.
            TArraySizes& arraySizes = *type.getArraySizes();

            // At least the dimensionalities have to match.
            if (! function[0].type->isArray() ||
                arraySizes.getNumDims() != function[0].type->getArraySizes()->getNumDims() + 1) {
                error(loc, "array constructor argument not correct type to construct array element", "constructor", "");
                return true;
            }

            if (arraySizes.isInnerUnsized()) {
                // "Arrays of arrays ..., and the size for any dimension is optional"
                // That means we need to adopt (from the first argument) the other array sizes into the type.
                for (int d = 1; d < arraySizes.getNumDims(); ++d) {
                    if (arraySizes.getDimSize(d) == UnsizedArraySize) {
                        arraySizes.setDimSize(d, function[0].type->getArraySizes()->getDimSize(d - 1));
                    }
                }
            }
        }
    }

    // Some array -> array type casts are okay
    if (arrayArg && function.getParamCount() == 1 && op != EOpConstructStruct && type.isArray() &&
        !type.isArrayOfArrays() && !function[0].type->isArrayOfArrays() &&
        type.getVectorSize() >= 1 && function[0].type->getVectorSize() >= 1)
        return false;

    if (arrayArg && op != EOpConstructStruct && ! type.isArrayOfArrays()) {
        error(loc, "constructing non-array constituent from array argument", "constructor", "");
        return true;
    }

    if (matrixInMatrix && ! type.isArray()) {
        return false;
    }

    if (overFull) {
        error(loc, "too many arguments", "constructor", "");
        return true;
    }

    if (op == EOpConstructStruct && ! type.isArray()) {
        if (isScalarConstructor(node))
            return false;

        // Self-type construction: e.g, we can construct a struct from a single identically typed object.
        if (function.getParamCount() == 1 && type == *function[0].type)
            return false;

        if ((int)type.getStruct()->size() != function.getParamCount()) {
            error(loc, "Number of constructor parameters does not match the number of structure fields", "constructor", "");
            return true;
        }
    }

    if ((op != EOpConstructStruct && size != 1 && size < type.computeNumComponents()) ||
        (op == EOpConstructStruct && size < type.computeNumComponents())) {
        error(loc, "not enough data provided for construction", "constructor", "");
        return true;
    }

    return false;
}